

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.hpp
# Opt level: O0

void __thiscall
boost::lockfree::detail::
fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
::deallocate_impl(fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                  *this,index_t index)

{
  bool bVar1;
  tag_t t;
  index_t i;
  tagged_index __i;
  node *pnVar2;
  ushort in_SI;
  runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
  *in_RDI;
  tagged_index new_pool;
  tagged_index old_pool;
  freelist_node *new_pool_node;
  undefined4 in_stack_ffffffffffffffd8;
  tagged_index local_20;
  
  pnVar2 = runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
           ::nodes(in_RDI);
  __i = std::atomic<boost::lockfree::detail::tagged_index>::load
                  ((atomic<boost::lockfree::detail::tagged_index> *)(in_RDI + 1),
                   memory_order_consume);
  do {
    t = tagged_index::get_tag((tagged_index *)&stack0xffffffffffffffe4);
    tagged_index::tagged_index(&local_20,in_SI,t);
    i = tagged_index::get_index((tagged_index *)&stack0xffffffffffffffe4);
    tagged_index::set_index((tagged_index *)(pnVar2 + (int)(uint)in_SI),i);
    bVar1 = std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_weak
                      ((atomic<boost::lockfree::detail::tagged_index> *)
                       CONCAT44(local_20,in_stack_ffffffffffffffd8),(tagged_index *)in_RDI,__i,
                       (memory_order)((ulong)(pnVar2 + (int)(uint)in_SI) >> 0x20));
  } while (!bVar1);
  return;
}

Assistant:

void deallocate_impl (index_t index)
    {
        freelist_node * new_pool_node = reinterpret_cast<freelist_node*>(NodeStorage::nodes() + index);
        tagged_index old_pool = pool_.load(memory_order_consume);

        for(;;) {
            tagged_index new_pool (index, old_pool.get_tag());
            new_pool_node->next.set_index(old_pool.get_index());

            if (pool_.compare_exchange_weak(old_pool, new_pool))
                return;
        }
    }